

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_size(Curl_easy *data)

{
  long size;
  long lVar1;
  CURLcode CVar2;
  
  if (((data->req).field_0xd9 & 0x60) == 0) {
    size = (data->req).size;
    CVar2 = CURLE_OK;
    if (size != -1) {
      lVar1 = (data->set).max_filesize;
      if (lVar1 < size && lVar1 != 0) {
        Curl_failf(data,"Maximum file size exceeded");
        CVar2 = CURLE_FILESIZE_EXCEEDED;
      }
      else {
        Curl_pgrsSetDownloadSize(data,size);
        (data->req).maxdownload = (data->req).size;
      }
    }
  }
  else {
    *(undefined4 *)&(data->req).size = 0xffffffff;
    *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
    *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
    *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_http_size(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  if(data->req.ignore_cl || k->chunk) {
    k->size = k->maxdownload = -1;
  }
  else if(k->size != -1) {
    if(data->set.max_filesize &&
       k->size > data->set.max_filesize) {
      failf(data, "Maximum file size exceeded");
      return CURLE_FILESIZE_EXCEEDED;
    }
    Curl_pgrsSetDownloadSize(data, k->size);
    k->maxdownload = k->size;
  }
  return CURLE_OK;
}